

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::Transpose>::addCase<4,3>
          (MatrixFuncCaseFactory<vkt::shaderexecutor::Functions::Transpose> *this,CaseContext *ctx,
          TestCaseGroup *group)

{
  char *__s;
  Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func;
  PrecisionCase *node;
  allocator<char> local_39;
  string local_38;
  
  __s = glu::getDataTypeName(TYPE_FLOAT_MAT3X4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  func = (Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)instance<vkt::shaderexecutor::Functions::Transpose<4,3>>();
  node = createFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,4,3>,tcu::Matrix<float,3,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                   (ctx,&local_38,func);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void				addCase			(const CaseContext& ctx, TestCaseGroup* group) const
	{
		const char*	const name = dataTypeNameOf<Matrix<float, Rows, Cols> >();
		group->addChild(createFuncCase(ctx, name, instance<GenF<Rows, Cols> >()));
	}